

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

UInt32 Backward(CLzmaEnc *p,UInt32 *backRes,UInt32 cur)

{
  UInt32 UVar1;
  UInt32 UVar2;
  ulong uVar3;
  uint uVar4;
  UInt32 UVar5;
  
  UVar5 = p->opt[cur].posPrev;
  UVar2 = p->opt[cur].backPrev;
  p->optimumEndIndex = cur;
  do {
    uVar4 = UVar5;
    uVar3 = (ulong)uVar4;
    if (p->opt[cur].prev1IsChar == 0) {
      UVar5 = p->opt[uVar3].posPrev;
      UVar1 = p->opt[uVar3].backPrev;
    }
    else {
      p->opt[uVar3].backPrev = 0xffffffff;
      p->opt[uVar3].prev1IsChar = 0;
      UVar5 = uVar4 - 1;
      p->opt[uVar3].posPrev = UVar5;
      if (p->opt[cur].prev2 != 0) {
        p->opt[UVar5].prev1IsChar = 0;
        UVar1 = p->opt[cur].backPrev2;
        p->opt[UVar5].posPrev = p->opt[cur].posPrev2;
        p->opt[UVar5].backPrev = UVar1;
      }
      UVar1 = 0xffffffff;
    }
    p->opt[uVar3].backPrev = UVar2;
    p->opt[uVar3].posPrev = cur;
    UVar2 = UVar1;
    cur = uVar4;
  } while (uVar3 != 0);
  *backRes = p->opt[0].backPrev;
  UVar5 = p->opt[0].posPrev;
  p->optimumCurrentIndex = UVar5;
  return UVar5;
}

Assistant:

static UInt32 Backward(CLzmaEnc *p, UInt32 *backRes, UInt32 cur)
{
  UInt32 posMem = p->opt[cur].posPrev;
  UInt32 backMem = p->opt[cur].backPrev;
  p->optimumEndIndex = cur;
  do
  {
    if (p->opt[cur].prev1IsChar)
    {
      MakeAsChar(&p->opt[posMem])
      p->opt[posMem].posPrev = posMem - 1;
      if (p->opt[cur].prev2)
      {
        p->opt[posMem - 1].prev1IsChar = False;
        p->opt[posMem - 1].posPrev = p->opt[cur].posPrev2;
        p->opt[posMem - 1].backPrev = p->opt[cur].backPrev2;
      }
    }
    {
      UInt32 posPrev = posMem;
      UInt32 backCur = backMem;
      
      backMem = p->opt[posPrev].backPrev;
      posMem = p->opt[posPrev].posPrev;
      
      p->opt[posPrev].backPrev = backCur;
      p->opt[posPrev].posPrev = cur;
      cur = posPrev;
    }
  }
  while (cur != 0);
  *backRes = p->opt[0].backPrev;
  p->optimumCurrentIndex  = p->opt[0].posPrev;
  return p->optimumCurrentIndex;
}